

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::LifetimeTests::details::FboOutputAttacher::drawAttachment
          (FboOutputAttacher *this,GLuint element,Surface *dst)

{
  Attacher *pAVar1;
  uint uVar2;
  deUint32 dVar3;
  int iVar4;
  GLenum err;
  RenderContext *context;
  Context *ctx;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  Type *pTVar6;
  undefined4 extraout_var;
  Functions *pFVar7;
  double __x;
  char *local_1d0;
  MessageBuilder local_1c8;
  undefined1 local_38 [8];
  Framebuffer fbo;
  Surface *dst_local;
  FboOutputAttacher *pFStack_10;
  GLuint element_local;
  FboOutputAttacher *this_local;
  
  fbo.super_ObjectWrapper._16_8_ = dst;
  dst_local._4_4_ = element;
  pFStack_10 = this;
  context = ContextWrapper::getRenderContext(&(this->super_OutputAttacher).super_ContextWrapper);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)local_38,context);
  ContextWrapper::enableLogging
            (&((this->super_OutputAttacher).m_attacher)->super_ContextWrapper,false);
  uVar2 = dst_local._4_4_;
  pAVar1 = (this->super_OutputAttacher).m_attacher;
  dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_38);
  (*pAVar1->_vptr_Attacher[1])(pAVar1,(ulong)uVar2,(ulong)dVar3);
  ctx = ContextWrapper::getContext(&(this->super_OutputAttacher).super_ContextWrapper);
  dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_38);
  drawFbo(ctx,dVar3,(Surface *)fbo.super_ObjectWrapper._16_8_);
  uVar2 = dst_local._4_4_;
  pAVar1 = (this->super_OutputAttacher).m_attacher;
  dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_38);
  (*pAVar1->_vptr_Attacher[2])(pAVar1,(ulong)uVar2,(ulong)dVar3);
  ContextWrapper::enableLogging
            (&((this->super_OutputAttacher).m_attacher)->super_ContextWrapper,true);
  ContextWrapper::log(&(this->super_OutputAttacher).super_ContextWrapper,__x);
  tcu::TestLog::operator<<(&local_1c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [21])"// Read pixels from ");
  pTVar6 = Attacher::getElementType((this->super_OutputAttacher).m_attacher);
  iVar4 = (*pTVar6->_vptr_Type[7])();
  local_1d0 = (char *)CONCAT44(extraout_var,iVar4);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1d0);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0xb0d2b5);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)((long)&dst_local + 4));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [18])" to output image.");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1c8);
  pFVar7 = ContextWrapper::gl(&(this->super_OutputAttacher).super_ContextWrapper);
  err = (*pFVar7->getError)();
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0x145);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)local_38);
  return;
}

Assistant:

void FboOutputAttacher::drawAttachment (GLuint element, Surface& dst)
{
	Framebuffer fbo(getRenderContext());
	m_attacher.enableLogging(false);
	m_attacher.attach(element, *fbo);
	drawFbo(getContext(), *fbo, dst);
	m_attacher.detach(element, *fbo);
	m_attacher.enableLogging(true);
	log() << TestLog::Message
		  << "// Read pixels from " << m_attacher.getElementType().getName() << " " << element
		  << " to output image."
		  << TestLog::EndMessage;
	GLU_CHECK_ERROR(gl().getError());
}